

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O2

void __thiscall toml::detail::location::retrace(location *this)

{
  if (this->location_ == 0) {
    this->line_number_ = 1;
    this->column_number_ = 1;
  }
  else {
    retrace_impl(this);
  }
  return;
}

Assistant:

TOML11_INLINE void location::retrace(/*restricted to n=1*/) noexcept
{
    assert(this->is_ok());
    if(this->location_ == 0)
    {
        this->location_ = 0;
        this->line_number_ = 1;
        this->column_number_ = 1;
    }
    else
    {
        this->retrace_impl();
    }
}